

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

weak_ptr<cppcms::application_specific_pool> __thiscall
cppcms::application::get_pool(application *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  weak_ptr<cppcms::application_specific_pool> wVar1;
  weak_ptr<cppcms::application_specific_pool> *in_stack_ffffffffffffffd8;
  element_type *this_00;
  
  this_00 = in_RDI;
  booster::hold_ptr<cppcms::application::_data>::operator->
            ((hold_ptr<cppcms::application::_data> *)(in_RSI + 8));
  std::weak_ptr<cppcms::application_specific_pool>::weak_ptr
            ((weak_ptr<cppcms::application_specific_pool> *)this_00,in_stack_ffffffffffffffd8);
  wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (weak_ptr<cppcms::application_specific_pool>)
         wVar1.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::weak_ptr<application_specific_pool> application::get_pool()
{
	return d->my_pool;
}